

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astar.cpp
# Opt level: O2

void __thiscall
indigox::algorithm::AStarOptimisation::GenerateNeighbourDistributions
          (AStarOptimisation *this,p_AStarQueueItem *d,
          vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          *out_nbrs)

{
  element_type *b;
  ulong uVar1;
  ulong uVar2;
  byte bVar3;
  ElnDist nbr;
  
  std::
  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::clear(out_nbrs);
  for (bVar3 = 0;
      b = (d->super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>).
          _M_ptr, bVar3 <= b->nbr_count; bVar3 = bVar3 + 1) {
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
              (&nbr,&b->distribution);
    for (uVar2 = 0; bVar3 != uVar2; uVar2 = uVar2 + 1) {
      uVar1 = ((d->
               super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr)->nbr_start_idx + uVar2;
      nbr.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[uVar1 >> 6] =
           nbr.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start[uVar1 >> 6] | 1L << ((byte)uVar1 & 0x3f);
    }
    std::
    vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::push_back(out_nbrs,&nbr);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&nbr);
  }
  return;
}

Assistant:

void AStarOptimisation::GenerateNeighbourDistributions(p_AStarQueueItem d, std::vector<ElnDist> *out_nbrs) {
  out_nbrs->clear();
  for (uint8_t i = 0; i <= d->nbr_count; ++i) {
    ElnDist nbr = ElnDist(d->distribution);
    for (uint8_t j = 0; j < i; ++j) {
      nbr.set(j + d->nbr_start_idx);
    }
    out_nbrs->push_back(nbr);
  }
}